

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool handle_compress(bz_stream *strm)

{
  EState *s_00;
  byte bVar1;
  Bool BVar2;
  bool local_21;
  EState *s;
  Bool progress_out;
  Bool progress_in;
  bz_stream *strm_local;
  
  s._7_1_ = 0;
  s._6_1_ = 0;
  s_00 = (EState *)strm->state;
  do {
    while( true ) {
      while( true ) {
        do {
          if (s_00->state == 1) {
            bVar1 = copy_output_until_stop(s_00);
            s._6_1_ = s._6_1_ | bVar1;
            if ((s_00->state_out_pos < s_00->numZ) ||
               (((s_00->mode == 4 && (s_00->avail_in_expect == 0)) &&
                (BVar2 = isempty_RL(s_00), BVar2 != '\0')))) goto LAB_0051eddd;
            prepare_new_block(s_00);
            s_00->state = 2;
            if (((s_00->mode == 3) && (s_00->avail_in_expect == 0)) &&
               (BVar2 = isempty_RL(s_00), BVar2 != '\0')) goto LAB_0051eddd;
          }
        } while (s_00->state != 2);
        bVar1 = copy_input_until_stop(s_00);
        s._7_1_ = s._7_1_ | bVar1;
        if ((s_00->mode == 2) || (s_00->avail_in_expect != 0)) break;
        flush_RL(s_00);
        BZ2_compressBlock(s_00,s_00->mode == 4);
        s_00->state = 1;
      }
      if (s_00->nblock < s_00->nblockMAX) break;
      BZ2_compressBlock(s_00,'\0');
      s_00->state = 1;
    }
  } while (s_00->strm->avail_in != 0);
LAB_0051eddd:
  local_21 = s._7_1_ != 0 || s._6_1_ != 0;
  return local_21;
}

Assistant:

static
Bool handle_compress ( bz_stream* strm )
{
   Bool progress_in  = False;
   Bool progress_out = False;
   EState* s = (EState *)strm->state;
   
   while (True) {

      if (s->state == BZ_S_OUTPUT) {
         progress_out |= copy_output_until_stop ( s );
         if (s->state_out_pos < s->numZ) break;
         if (s->mode == BZ_M_FINISHING && 
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
         prepare_new_block ( s );
         s->state = BZ_S_INPUT;
         if (s->mode == BZ_M_FLUSHING && 
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
      }

      if (s->state == BZ_S_INPUT) {
         progress_in |= copy_input_until_stop ( s );
         if (s->mode != BZ_M_RUNNING && s->avail_in_expect == 0) {
            flush_RL ( s );
            BZ2_compressBlock ( s, (Bool)(s->mode == BZ_M_FINISHING) );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->nblock >= s->nblockMAX) {
            BZ2_compressBlock ( s, False );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->strm->avail_in == 0) {
            break;
         }
      }

   }

   return progress_in || progress_out;
}